

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::MultiTexShader::setUniforms
          (MultiTexShader *this,Context *ctx,deUint32 program)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  ulong uVar6;
  string ndxStr;
  Array<float,_16> a;
  long local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
    local_1f0 = 0;
    uVar6 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,(int)uVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+(local_1a8,"u_sampler",&local_1c8);
      uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_1a8[0]._M_dataplus._M_p);
      (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar1,uVar6 & 0xffffffff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::operator+(&local_1e8,"u_trans",&local_1c8);
      uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_1e8._M_dataplus._M_p);
      lVar2 = (long)(((this->m_transformations).
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
              local_1f0;
      lVar3 = 0;
      pbVar4 = local_1a8;
      do {
        lVar5 = 0;
        do {
          *(undefined4 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar5) =
               *(undefined4 *)(lVar2 + lVar5);
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x10);
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pbVar4->field_2;
      } while (lVar3 != 4);
      (*ctx->_vptr_Context[0x65])(ctx,(ulong)uVar1,1,0,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(local_1a8,"u_texScale",&local_1c8);
      uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_1a8[0]._M_dataplus._M_p);
      (*ctx->_vptr_Context[0x5f])
                (ctx,(ulong)uVar1,1,
                 (this->m_texScales).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::operator+(local_1a8,"u_texBias",&local_1c8);
      uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,local_1a8[0]._M_dataplus._M_p);
      (*ctx->_vptr_Context[0x5f])
                (ctx,(ulong)uVar1,1,
                 (this->m_texBiases).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      local_1f0 = local_1f0 + 0x40;
    } while ((long)uVar6 < (long)*(int *)&(this->super_ShaderProgram).field_0x154);
  }
  return;
}

Assistant:

void MultiTexShader::setUniforms (sglr::Context& ctx, deUint32 program) const
{
	ctx.useProgram(program);

	// Sampler and matrix uniforms.

	for (int ndx = 0; ndx < m_numUnits; ndx++)
	{
		string			ndxStr		= de::toString(ndx);

		ctx.uniform1i(ctx.getUniformLocation(program, ("u_sampler" + ndxStr).c_str()), ndx);
		ctx.uniformMatrix4fv(ctx.getUniformLocation(program, ("u_trans" + ndxStr).c_str()), 1, GL_FALSE, (GLfloat*)&m_transformations[ndx].getColumnMajorData()[0]);
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texScale" + ndxStr).c_str()), 1, m_texScales[ndx].getPtr());
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texBias" + ndxStr).c_str()), 1, m_texBiases[ndx].getPtr());
	}
}